

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_var.h
# Opt level: O2

void var_act_bump(solver_t *s,uint var)

{
  heap_t *p;
  int iVar1;
  uint uVar2;
  sdbl_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  sdbl_t sVar6;
  ulong uVar7;
  ulong uVar8;
  act_t aVar9;
  
  psVar3 = vec_sdbl_data(s->activity);
  uVar4 = psVar3[var];
  uVar5 = s->var_act_inc;
  uVar7 = uVar5;
  if (uVar4 >= uVar5 && uVar4 != uVar5) {
    uVar7 = uVar4;
  }
  if (uVar4 < uVar5) {
    uVar5 = uVar4;
  }
  uVar8 = ((uVar5 & 0xffffffffffff) >> ((char)(uVar7 >> 0x30) - (char)(uVar5 >> 0x30) & 0x3fU)) +
          (uVar7 & 0xffffffffffff);
  uVar5 = (uVar7 >> 0x30) + (uVar8 >> 0x30);
  uVar4 = 0xffffffffffffffff;
  if (uVar5 < 0x10000) {
    uVar4 = (uVar5 << 0x30) + (uVar8 >> ((byte)(uVar8 >> 0x30) & 0x3f));
  }
  psVar3[var] = uVar4;
  if ((s->opts).var_act_limit < uVar4) {
    psVar3 = vec_sdbl_data(s->activity);
    uVar2 = s->activity->size;
    uVar4 = (ulong)(s->opts).var_act_rescale;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = psVar3[uVar5] >> 0x30;
      sVar6 = psVar3[uVar5] & 0xffffffffffff | uVar7 - uVar4 << 0x30;
      if (uVar7 < uVar4) {
        sVar6 = 0x800000000000;
      }
      psVar3[uVar5] = sVar6;
    }
    uVar5 = s->var_act_inc >> 0x30;
    aVar9 = s->var_act_inc & 0xffffffffffff | uVar5 - uVar4 << 0x30;
    if (uVar5 < uVar4) {
      aVar9 = 0x800000000000;
    }
    s->var_act_inc = aVar9;
  }
  iVar1 = heap_in_heap(s->var_order,var);
  if (iVar1 != 0) {
    p = s->var_order;
    iVar1 = heap_in_heap(p,var);
    if (iVar1 != 0) {
      uVar2 = vec_int_at(p->indices,var);
      heap_percolate_up(p,uVar2);
      return;
    }
    __assert_fail("heap_in_heap(p, entry)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/satoko/utils/heap.h"
                  ,0x71,"void heap_decrease(heap_t *, unsigned int)");
  }
  return;
}

Assistant:

static inline void var_act_bump(solver_t *s, unsigned var)
{
    act_t *activity = vec_act_data(s->activity);

    activity[var] = sdbl_add(activity[var], s->var_act_inc);
    if (activity[var] > s->opts.var_act_limit)
        var_act_rescale(s);
    if (heap_in_heap(s->var_order, var))
        heap_decrease(s->var_order, var);
}